

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

string * __thiscall
Debugger::GetFile_abi_cxx11_(string *__return_storage_ptr__,Debugger *this,lua_Debug *ar)

{
  lua_State *L;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *__s;
  char *pcVar4;
  allocator local_21;
  
  L = this->currentL;
  if (L == (lua_State *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "";
    __s = "";
  }
  else {
    pcVar2 = getDebugSource(ar);
    iVar1 = getDebugCurrentLine(ar);
    if (iVar1 < 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_21);
      return __return_storage_ptr__;
    }
    pcVar2 = pcVar2 + (*pcVar2 == '@');
    (*lua_pushcclosure)(L,FixPath,0);
    (*lua_pushstring)(L,pcVar2);
    iVar1 = lua_pcall(L,1,1,0);
    if (iVar1 == 0) {
      __s = (*lua_tolstring)(L,-1,(size_t *)0x0);
      (*lua_settop)(L,-2);
      if (__s != (char *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        sVar3 = strlen(__s);
        pcVar4 = __s + sVar3;
        goto LAB_0014512d;
      }
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(pcVar2);
    pcVar4 = pcVar2 + sVar3;
    __s = pcVar2;
  }
LAB_0014512d:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string Debugger::GetFile(lua_Debug *ar) const {
	if (!currentL) {
		return "";
	}

	auto L = currentL;

	const char *file = getDebugSource(ar);
	if (getDebugCurrentLine(ar) < 0)
		return file;
	if (strlen(file) > 0 && file[0] == '@')
		file++;
	lua_pushcclosure(L, FixPath, 0);
	lua_pushstring(L, file);
	const int result = lua_pcall(L, 1, 1, 0);
	if (result == LUA_OK) {
		const auto p = lua_tostring(L, -1);
		lua_pop(L, 1);
		if (p) {
			return p;
		}
	}
	// todo: handle error
	return file;
}